

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadapi_pthreads.c
# Opt level: O0

void ThreadAPI_Sleep(uint milliseconds)

{
  undefined1 local_30 [8];
  timespec timeToSleep;
  long nsRemainder;
  time_t seconds;
  uint milliseconds_local;
  
  local_30 = (undefined1  [8])((ulong)milliseconds / 1000);
  timeToSleep.tv_sec = (__time_t)((milliseconds % 1000) * 1000000);
  timeToSleep.tv_nsec = timeToSleep.tv_sec;
  nanosleep((timespec *)local_30,(timespec *)0x0);
  return;
}

Assistant:

void ThreadAPI_Sleep(unsigned int milliseconds)
{
#ifdef TI_RTOS
    Task_sleep(milliseconds);
#else
    time_t seconds = milliseconds / 1000;
    long nsRemainder = (milliseconds % 1000) * 1000000;
    struct timespec timeToSleep = { seconds, nsRemainder };
    (void)nanosleep(&timeToSleep, NULL);
#endif
}